

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1a7362::DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test::TestBody
          (DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test *this)

{
  AssertHelper AVar1;
  AssertHelper AVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  char *message;
  bool expect_output;
  DeathTest *gtest_dt;
  AssertHelper local_88;
  Message local_80 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  bVar3 = testing::internal::AlwaysTrue();
  if (!bVar3) goto LAB_00542ca4;
  ::(anonymous_namespace)::MatchOutput_abi_cxx11_
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_60,(_anonymous_namespace_ *)0x0,expect_output);
  local_48.vtable_ = local_60.vtable_;
  local_48.buffer_ = local_60.buffer_;
  local_60.vtable_ = (VTable *)0x0;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018cdbe0;
  bVar4 = testing::internal::DeathTest::Create
                    ("{ ::google::protobuf::internal::NoopDebugCounter {}.Inc(); for (int i = 0; i < 2; ++i) { ::google::protobuf::internal::NoopDebugCounter {}.Inc(); } for (int i = 0; i < 3; ++i) { ::google::protobuf::internal::NoopDebugCounter {}.Inc(); } ::google::protobuf::internal::NoopDebugCounter {}.Inc(); exit(0); }"
                     ,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                       *)&local_48,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
                     ,0x62,(DeathTest **)&local_88);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_48);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_60);
  AVar1.data_ = local_88.data_;
  bVar3 = true;
  if (bVar4) {
    if (local_88.data_ != (AssertHelperData *)0x0) {
      iVar6 = (**(code **)(*(long *)local_88.data_ + 0x10))();
      AVar2.data_ = local_88.data_;
      if (iVar6 == 0) {
        testing::ExitedWithCode::ExitedWithCode((ExitedWithCode *)local_80,0);
        iVar6 = (**(code **)(*(long *)local_88.data_ + 0x18))();
        bVar3 = testing::ExitedWithCode::operator()((ExitedWithCode *)local_80,iVar6);
        cVar5 = (**(code **)(*(long *)AVar2.data_ + 0x20))(AVar2.data_,bVar3);
        if (cVar5 != '\0') goto LAB_00542c8b;
        bVar3 = true;
        bVar4 = false;
      }
      else {
        if (iVar6 == 1) {
          bVar3 = testing::internal::AlwaysTrue();
          if (bVar3) {
            exit(0);
          }
          (**(code **)(*(long *)local_88.data_ + 0x28))(local_88.data_,2);
          (**(code **)(*(long *)AVar2.data_ + 0x28))(AVar2.data_,0);
        }
LAB_00542c8b:
        bVar3 = false;
        bVar4 = true;
      }
      (**(code **)(*(long *)AVar1.data_ + 8))(AVar1.data_);
      if (!bVar4) goto LAB_00542ca0;
    }
    bVar3 = false;
  }
LAB_00542ca0:
  if (!bVar3) {
    return;
  }
LAB_00542ca4:
  testing::Message::Message(local_80);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
             ,0x62,message);
  testing::internal::AssertHelper::operator=(&local_88,local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if (local_80[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_80[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

TEST(DebugCounterTest, MacroProvidesReportAtExitDependingOnBuild) {
#if defined(PROTOBUF_INTERNAL_ENABLE_DEBUG_COUNTERS)
  constexpr bool match_output = true;
#else
  constexpr bool match_output = false;

  // and test that the operations have no side effects.
  static_assert((PROTOBUF_DEBUG_COUNTER("Foo.Bar").Inc(), true), "");
#endif

  EXPECT_EXIT(
      {
        PROTOBUF_DEBUG_COUNTER("Foo.Bar").Inc();
        for (int i = 0; i < 2; ++i) {
          PROTOBUF_DEBUG_COUNTER("Foo.Baz").Inc();
        }
        for (int i = 0; i < 3; ++i) {
          PROTOBUF_DEBUG_COUNTER("Num.32").Inc();
        }
        PROTOBUF_DEBUG_COUNTER("Num.128").Inc();
        exit(0);
      },
      ExitedWithCode(0), MatchOutput(match_output));
}